

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void SubtractionHelper<int,unsigned_int,4>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (int *lhs,uint *rhs,int *result)

{
  code *pcVar1;
  int iVar2;
  long lVar3;
  undefined4 *in_RDX;
  uint *in_RSI;
  int *in_RDI;
  int64_t tmp;
  
  lVar3 = (long)*in_RDI - (ulong)*in_RSI;
  if (SBORROW8((long)*in_RDI,(ulong)*in_RSI)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  iVar2 = std::numeric_limits<int>::min();
  if (iVar2 <= lVar3) {
    *in_RDX = (int)lVar3;
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}